

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_generic_iterator_t
xcb_input_feedback_state_data_string_keysyms_end
          (xcb_input_feedback_state_t *R,xcb_input_feedback_state_data_t *S)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1.data = (S->string).keysyms + (S->string).num_keysyms;
  xVar1._8_8_ = (ulong)(uint)((int)xVar1.data - (int)S) << 0x20;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_feedback_state_data_string_keysyms_end (const xcb_input_feedback_state_t *R,
                                                  const xcb_input_feedback_state_data_t *S)
{
    xcb_generic_iterator_t i;
    i.data = S->string.keysyms + S->string.num_keysyms;
    i.rem = 0;
    i.index = (char *) i.data - (char *) S;
    return i;
}